

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O2

bool __thiscall FSerializer::BeginObject(FSerializer *this,char *name)

{
  FReader *this_00;
  Value *v;
  FJSONObject local_28;
  
  if (this->w == (FWriter *)0x0) {
    v = FReader::FindKey(this->r,name);
    if (v == (Value *)0x0) {
      return false;
    }
    if ((v->data_).f.flags != 3) {
      __assert_fail("val->IsObject()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/serializer.cpp"
                    ,0x249,"bool FSerializer::BeginObject(const char *)");
    }
    this_00 = this->r;
    FJSONObject::FJSONObject(&local_28,v);
    TArray<FJSONObject,_FJSONObject>::Push(&this_00->mObjects,&local_28);
  }
  else {
    WriteKey(this,name);
    FWriter::StartObject(this->w);
    local_28.mObject._0_1_ = 1;
    TArray<bool,_bool>::Push(&this->w->mInObject,(bool *)&local_28);
  }
  return true;
}

Assistant:

bool FSerializer::BeginObject(const char *name)
{
	if (isWriting())
	{
		WriteKey(name);
		w->StartObject();
		w->mInObject.Push(true);
	}
	else
	{
		auto val = r->FindKey(name);
		if (val != nullptr)
		{
			assert(val->IsObject());
			if (val->IsObject())
			{
				r->mObjects.Push(FJSONObject(val));
			}
			else
			{
				Printf(TEXTCOLOR_RED "Object expected for '%s'", name);
				mErrors++;
				return false;
			}
		}
		else
		{
			return false;
		}
	}
	return true;
}